

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O2

UBool icu_63::PropNameData::containsName(BytesTrie *trie,char *name)

{
  byte bVar1;
  UStringTrieResult UVar2;
  char *pcVar3;
  
  if (name == (char *)0x0) {
    return '\0';
  }
  UVar2 = USTRINGTRIE_NO_VALUE;
  while( true ) {
    do {
      pcVar3 = name + 1;
      if (*name == '\0') {
        return 1 < (int)UVar2;
      }
      bVar1 = uprv_asciitolower_63(*name);
      name = pcVar3;
    } while (((bVar1 - 0x20 < 0x40) &&
             ((0x8000000000002001U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) != 0)) ||
            ((byte)(bVar1 - 9) < 5));
    if ((UVar2 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) break;
    UVar2 = BytesTrie::next(trie,(uint)bVar1);
  }
  return '\0';
}

Assistant:

UBool PropNameData::containsName(BytesTrie &trie, const char *name) {
    if(name==NULL) {
        return FALSE;
    }
    UStringTrieResult result=USTRINGTRIE_NO_VALUE;
    char c;
    while((c=*name++)!=0) {
        c=uprv_invCharToLowercaseAscii(c);
        // Ignore delimiters '-', '_', and ASCII White_Space.
        if(c==0x2d || c==0x5f || c==0x20 || (0x09<=c && c<=0x0d)) {
            continue;
        }
        if(!USTRINGTRIE_HAS_NEXT(result)) {
            return FALSE;
        }
        result=trie.next((uint8_t)c);
    }
    return USTRINGTRIE_HAS_VALUE(result);
}